

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  int iVar1;
  int iVar2;
  ulong local_28;
  size_t i;
  int ret;
  uchar assign_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  iVar1 = (int)((uint)assign | -(uint)assign & 0xff) >> 7;
  iVar2 = mbedtls_mpi_grow(X,Y->n);
  if (iVar2 == 0) {
    X->s = X->s * (1 - iVar1) + Y->s * iVar1;
    for (local_28 = 0; local_28 < Y->n; local_28 = local_28 + 1) {
      X->p[local_28] = X->p[local_28] * (long)(1 - iVar1) + Y->p[local_28] * (ulong)(byte)iVar1;
    }
    for (; local_28 < X->n; local_28 = local_28 + 1) {
      X->p[local_28] = (long)(1 - iVar1) * X->p[local_28];
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_safe_cond_assign( mbedtls_mpi *X, const mbedtls_mpi *Y, unsigned char assign )
{
    int ret = 0;
    size_t i;

    /* make sure assign is 0 or 1 in a time-constant manner */
    assign = (assign | (unsigned char)-assign) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );

    X->s = X->s * ( 1 - assign ) + Y->s * assign;

    for( i = 0; i < Y->n; i++ )
        X->p[i] = X->p[i] * ( 1 - assign ) + Y->p[i] * assign;

    for( ; i < X->n; i++ )
        X->p[i] *= ( 1 - assign );

cleanup:
    return( ret );
}